

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaAigerExt.c
# Opt level: O3

int * Gia_AigerReadMapping(uchar **ppPos,int nSize)

{
  byte bVar1;
  uchar *puVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  int *piVar6;
  byte bVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  byte *pbVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  byte *pbVar17;
  int iVar18;
  bool bVar19;
  
  uVar14 = (ulong)(uint)nSize;
  puVar2 = *ppPos;
  lVar5 = 0;
  uVar10 = 0;
  do {
    uVar10 = (long)((int)uVar10 << 8) | (ulong)puVar2[lVar5];
    lVar5 = lVar5 + 1;
  } while ((int)lVar5 != 4);
  pbVar17 = puVar2 + 4;
  *ppPos = pbVar17;
  iVar18 = (nSize + (int)(puVar2 + uVar10)) - (int)pbVar17;
  piVar6 = (int *)calloc((long)iVar18,4);
  if (4 < (int)uVar10) {
    iVar9 = 0;
    do {
      iVar4 = (int)uVar14;
      pbVar13 = pbVar17 + 1;
      *ppPos = pbVar13;
      uVar11 = (uint)*pbVar17;
      if ((char)*pbVar17 < '\0') {
        bVar7 = 0;
        uVar12 = 0;
        do {
          uVar12 = uVar12 | (uVar11 & 0x7f) << (bVar7 & 0x1f);
          pbVar17 = pbVar13 + 1;
          *ppPos = pbVar17;
          bVar1 = *pbVar13;
          uVar11 = (uint)bVar1;
          bVar7 = bVar7 + 7;
          pbVar13 = pbVar17;
        } while ((char)bVar1 < '\0');
      }
      else {
        bVar7 = 0;
        uVar12 = 0;
        pbVar17 = pbVar13;
      }
      uVar14 = (ulong)(iVar4 + 1U);
      uVar12 = uVar11 << (bVar7 & 0x1f) | uVar12;
      piVar6[iVar4] = uVar12;
      if (-1 < (int)uVar12) {
        uVar14 = (ulong)(int)(iVar4 + 1U);
        pbVar13 = pbVar17;
        uVar11 = 0;
        do {
          pbVar17 = pbVar13 + 1;
          *ppPos = pbVar17;
          uVar15 = (uint)*pbVar13;
          if ((char)*pbVar13 < '\0') {
            bVar7 = 0;
            uVar16 = 0;
            pbVar13 = pbVar17;
            do {
              uVar16 = uVar16 | (uVar15 & 0x7f) << (bVar7 & 0x1f);
              pbVar17 = pbVar13 + 1;
              *ppPos = pbVar17;
              bVar1 = *pbVar13;
              uVar15 = (uint)bVar1;
              bVar7 = bVar7 + 7;
              pbVar13 = pbVar17;
            } while ((char)bVar1 < '\0');
          }
          else {
            bVar7 = 0;
            uVar16 = 0;
          }
          uVar16 = uVar15 << (bVar7 & 0x1f) | uVar16;
          iVar8 = (int)uVar16 >> 1;
          iVar3 = -iVar8;
          if ((uVar16 & 1) != 0) {
            iVar3 = iVar8;
          }
          iVar9 = iVar9 + iVar3;
          piVar6[uVar14] = iVar9;
          uVar14 = uVar14 + 1;
          bVar19 = uVar11 != uVar12;
          pbVar13 = pbVar17;
          uVar11 = uVar11 + 1;
        } while (bVar19);
      }
      piVar6[iVar9] = iVar4;
      nSize = (int)uVar14;
    } while (pbVar17 < puVar2 + uVar10);
  }
  if (iVar18 < nSize) {
    __assert_fail("iOffset <= nAlloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaAigerExt.c"
                  ,0xa1,"int *Gia_AigerReadMapping(unsigned char **, int)");
  }
  return piVar6;
}

Assistant:

int * Gia_AigerReadMapping( unsigned char ** ppPos, int nSize )
{
    int * pMapping;
    unsigned char * pStop;
    int k, j, nFanins, nAlloc, iNode = 0, iOffset = nSize;
    pStop = *ppPos;
    pStop += Gia_AigerReadInt( *ppPos ); *ppPos += 4;
    nAlloc = nSize + pStop - *ppPos;
    pMapping = ABC_CALLOC( int, nAlloc );
    while ( *ppPos < pStop )
    {
        k = iOffset;
        pMapping[k++] = nFanins = Gia_AigerReadUnsigned( ppPos );
        for ( j = 0; j <= nFanins; j++ )
            pMapping[k++] = iNode = Gia_AigerReadDiffValue( ppPos, iNode );
        pMapping[iNode] = iOffset;
        iOffset = k;
    }
    assert( iOffset <= nAlloc );
    return pMapping;
}